

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_23c3742::ReaderSpy::read(ReaderSpy *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  long lVar2;
  undefined4 in_register_00000034;
  char *chars;
  string buf;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar2 = (**(code **)((long)*(this->r).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x20))();
  if (lVar2 != 0) {
    std::__cxx11::string::string((string *)&local_40,(string *)&this->prefix);
    std::__cxx11::string::append<char_const*,void>
              ((string *)&local_40,(char *)CONCAT44(in_register_00000034,__fd),
               (char *)CONCAT44(in_register_00000034,__fd) + lVar2);
    peVar1 = (this->s).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)((long)*peVar1 + 0x20))(peVar1,local_40,local_38);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return lVar2;
}

Assistant:

size_t read(void* buffer, size_t n) override {
    auto c = r->read(buffer, n);
    if (c > 0) {
      auto chars = reinterpret_cast<const char*>(buffer);
      std::string buf = prefix;
      buf.append(chars, chars + c);
      s->write(buf.data(), buf.size());
    }
    return c;
  }